

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  uint uVar1;
  byte bVar2;
  ImGuiSortDirection IVar3;
  
  if (column->SortOrder == -1) {
    IVar3 = column->SortDirectionsAvailList;
LAB_001b557a:
    IVar3 = IVar3 & (ImGuiSortDirection_Descending|ImGuiSortDirection_Ascending);
  }
  else {
    uVar1 = 1;
    bVar2 = 0;
    do {
      if (((column->SortDirectionsAvailList >> (bVar2 & 0x1f) ^ column->field_0x6d) & 3) == 0) {
        IVar3 = column->SortDirectionsAvailList >>
                (char)(uVar1 % ((byte)column->field_0x6d >> 2 & 3)) * '\x02';
        goto LAB_001b557a;
      }
      uVar1 = uVar1 + 1;
      bVar2 = bVar2 + 2;
    } while (uVar1 != 4);
    IVar3 = ImGuiSortDirection_None;
  }
  return IVar3;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}